

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_save(t_gobj *z,_binbuf *b)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  t_symbol *ptVar11;
  t_symbol *ptVar12;
  t_symbol *ptVar13;
  double local_110;
  char *local_90;
  char *objname;
  t_symbol *srl [3];
  t_symbol *local_68;
  t_symbol *bflcol [3];
  t_radio *x;
  _binbuf *b_local;
  t_gobj *z_local;
  
  if (*(int *)&z[0x4a].g_next == 0) {
    if (*(int *)((long)&z[0x4a].g_next + 4) == 0) {
      local_90 = "hradio";
    }
    else {
      local_90 = "hdl";
    }
  }
  else if (*(int *)((long)&z[0x4a].g_next + 4) == 0) {
    local_90 = "vradio";
  }
  else {
    local_90 = "vdl";
  }
  iemgui_save((t_iemgui *)z,(t_symbol **)&objname,&local_68);
  ptVar11 = gensym("#X");
  ptVar12 = gensym("obj");
  sVar1 = *(short *)&z[2].g_next;
  sVar2 = *(short *)((long)&z[2].g_next + 2);
  ptVar13 = gensym(local_90);
  iVar3 = *(int *)((long)&z[4].g_pd + 4);
  iVar4 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  uVar5 = *(undefined4 *)&z[0x49].g_next;
  iVar9 = iem_symargstoint((t_iem_init_symargs *)&z[0x44].g_next);
  uVar6 = *(undefined4 *)((long)&z[0x49].g_next + 4);
  uVar7 = *(undefined4 *)&z[5].g_pd;
  uVar8 = *(undefined4 *)((long)&z[5].g_pd + 4);
  iVar10 = iem_fstyletoint((t_iem_fstyle_flags *)(z + 0x44));
  if (((ulong)z[0x44].g_next & 1) == 0) {
    local_110 = 0.0;
  }
  else {
    local_110 = (double)*(float *)((long)&z[0x4a].g_pd + 4);
  }
  binbuf_addv(b,"ssiisiiiisssiiiisssf",local_110,ptVar11,ptVar12,(ulong)(uint)(int)sVar1,
              (ulong)(uint)(int)sVar2,ptVar13,iVar3 / iVar4,uVar5,iVar9,uVar6,objname,srl[0],srl[1],
              uVar7,uVar8,iVar10,*(undefined4 *)((long)&z[0x44].g_pd + 4),local_68,bflcol[0],
              bflcol[1]);
  binbuf_addv(b,";");
  return;
}

Assistant:

static void radio_save(t_gobj *z, t_binbuf *b)
{
    t_radio *x = (t_radio *)z;
    t_symbol *bflcol[3];
    t_symbol *srl[3];

    const char*objname;
    if(x->x_orientation == horizontal)
    {
        if(x->x_compat)
            objname="hdl";
        else
            objname="hradio";
    } else {
        if(x->x_compat)
            objname="vdl";
        else
            objname="vradio";
    }

    iemgui_save(&x->x_gui, srl, bflcol);
    binbuf_addv(b, "ssiisiiiisssiiiisssf", gensym("#X"), gensym("obj"),
                (int)x->x_gui.x_obj.te_xpix,
                (int)x->x_gui.x_obj.te_ypix,
        gensym(objname),
                x->x_gui.x_w/IEMGUI_ZOOM(x),
                x->x_change, iem_symargstoint(&x->x_gui.x_isa), x->x_number,
                srl[0], srl[1], srl[2],
                x->x_gui.x_ldx, x->x_gui.x_ldy,
                iem_fstyletoint(&x->x_gui.x_fsf), x->x_gui.x_fontsize,
                bflcol[0], bflcol[1], bflcol[2],
                x->x_gui.x_isa.x_loadinit?x->x_fval:0.);
    binbuf_addv(b, ";");
}